

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall echo_server::echo_server(echo_server *this,epoll *ep,ipv4_endpoint *param_2)

{
  echo_server *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  on_connected_t local_48;
  ipv4_endpoint local_28;
  ipv4_endpoint *local_20;
  ipv4_endpoint *local_endpoint_local;
  epoll *ep_local;
  echo_server *this_local;
  
  this->ep = ep;
  local_28 = *param_2;
  local_70 = on_new_connection;
  local_68 = 0;
  local_78 = this;
  local_20 = param_2;
  local_endpoint_local = (ipv4_endpoint *)ep;
  ep_local = (epoll *)this;
  std::bind<void(echo_server::*)(),echo_server*>
            (&local_60,(offset_in_echo_server_to_subr *)&local_70,&local_78);
  std::function<void()>::function<std::_Bind<void(echo_server::*(echo_server*))()>,void>
            ((function<void()> *)&local_48,&local_60);
  server_socket::server_socket(&this->ss,ep,local_28,&local_48);
  std::function<void_()>::~function(&local_48);
  std::
  map<echo_server::connection_*,_std::unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_>,_std::less<echo_server::connection_*>,_std::allocator<std::pair<echo_server::connection_*const,_std::unique_ptr<echo_server::connection,_std::default_delete<echo_server::connection>_>_>_>_>
  ::map(&this->connections);
  return;
}

Assistant:

echo_server::echo_server(epoll &ep, ipv4_endpoint const& local_endpoint)
    : ep(ep)
    , ss{ep, local_endpoint, std::bind(&echo_server::on_new_connection, this)}
{}